

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::IfNode::do_render(IfNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  reference this_00;
  runtime_error *this_01;
  long in_RDI;
  bool enter_branch;
  pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_> *branch;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  *__range2;
  shared_ptr<minja::Context> *in_stack_00000130;
  Expression *in_stack_00000138;
  shared_ptr<minja::Context> *in_stack_00000300;
  ostringstream *in_stack_00000308;
  TemplateNode *in_stack_00000310;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  *in_stack_ffffffffffffff48;
  Value *in_stack_ffffffffffffff50;
  Value *in_stack_ffffffffffffff68;
  bool local_39;
  __normal_iterator<const_std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_*,_std::vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RDI + 0x20;
  local_28._M_current =
       (pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_> *)
       std::
       vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
       ::begin(in_stack_ffffffffffffff48);
  std::
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_*,_std::vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_*,_std::vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_*,_std::vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>_>
              ::operator*(&local_28);
    local_39 = true;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
    if (bVar1) {
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x31a9e5);
      Expression::evaluate(in_stack_00000138,in_stack_00000130);
      local_39 = Value::to_bool(in_stack_ffffffffffffff68);
      Value::~Value(in_stack_ffffffffffffff50);
    }
    if (local_39 != false) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_*,_std::vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>_>
    ::operator++(&local_28);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this_00->second);
  if (bVar1) {
    std::__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x31aac8);
    TemplateNode::render(in_stack_00000310,in_stack_00000308,in_stack_00000300);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"IfNode.cascade.second is null");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
      for (const auto& branch : cascade) {
          auto enter_branch = true;
          if (branch.first) {
            enter_branch = branch.first->evaluate(context).to_bool();
          }
          if (enter_branch) {
            if (!branch.second) throw std::runtime_error("IfNode.cascade.second is null");
              branch.second->render(out, context);
              return;
          }
      }
    }